

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::deepCopy
          (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this,
          AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
          *sr)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar3;
  undefined4 extraout_var_01;
  long *plVar4;
  
  iVar2 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
  plVar4 = *(long **)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
  if (plVar4 != *(long **)(CONCAT44(extraout_var_00,iVar2) + 8)) {
    do {
      puVar3 = (undefined8 *)operator_new(0x20);
      lVar1 = *plVar4;
      *puVar3 = &PTR__HitCounter_001fa4e0;
      puVar3[1] = *(undefined8 *)(lVar1 + 8);
      puVar3[2] = *(undefined8 *)(lVar1 + 0x10);
      puVar3[3] = *(undefined8 *)(lVar1 + 0x18);
      (*(this->
        super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
        ).super_ThreadSafe._vptr_ThreadSafe[0x10])(this,puVar3);
      plVar4 = plVar4 + 1;
      iVar2 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
    } while (plVar4 != *(long **)(CONCAT44(extraout_var_01,iVar2) + 8));
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::vector<T_Ptr*>>& sr) {
    for (const_iterator it = sr.list().begin(); it != sr.list().end(); ++it) {
      registerNew(new T_Ptr(**it));
    }
  }